

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O3

spv_result_t
spvExtInstTableNameLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,char *name,spv_ext_inst_desc *pEntry)

{
  uint uVar1;
  spv_ext_inst_group_t *psVar2;
  int iVar3;
  spv_ext_inst_desc psVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (table == (spv_ext_inst_table)0x0) {
    return SPV_ERROR_INVALID_TABLE;
  }
  if (pEntry == (spv_ext_inst_desc *)0x0) {
    return SPV_ERROR_INVALID_POINTER;
  }
  uVar1 = table->count;
  if ((ulong)uVar1 != 0) {
    psVar2 = table->groups;
    uVar6 = 0;
    do {
      if ((psVar2[uVar6].type == type) && (uVar5 = (ulong)psVar2[uVar6].count, uVar5 != 0)) {
        psVar4 = psVar2[uVar6].entries;
        do {
          iVar3 = strcmp(name,psVar4->name);
          if (iVar3 == 0) {
            *pEntry = psVar4;
            return SPV_SUCCESS;
          }
          psVar4 = psVar4 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  return SPV_ERROR_INVALID_LOOKUP;
}

Assistant:

spv_result_t spvExtInstTableNameLookup(const spv_ext_inst_table table,
                                       const spv_ext_inst_type_t type,
                                       const char* name,
                                       spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (!strcmp(name, entry.name)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}